

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>::
~VmaVector(VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
           *this)

{
  VmaFree((this->m_Allocator).m_pCallbacks,this->m_pArray);
  return;
}

Assistant:

~VmaVector() { VmaFree(m_Allocator.m_pCallbacks, m_pArray); }